

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  ForeachLoopListSyntax *pFVar1;
  SeparatedSyntaxList<slang::syntax::NameSyntax> *unaff_retaddr;
  Token *in_stack_00000008;
  NameSyntax *in_stack_00000010;
  Token *in_stack_00000018;
  BumpAllocator *in_stack_00000020;
  Token *in_stack_00000030;
  BumpAllocator *in_stack_000000d8;
  SeparatedSyntaxList<slang::syntax::NameSyntax> *in_stack_000000e0;
  BumpAllocator *in_stack_ffffffffffffff88;
  NameSyntax *in_stack_ffffffffffffff90;
  
  parsing::Token::deepClone((Token *)in_stack_000000e0,in_stack_000000d8);
  not_null<slang::syntax::NameSyntax_*>::operator*
            ((not_null<slang::syntax::NameSyntax_*> *)0xa57783);
  deepClone<slang::syntax::NameSyntax>(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  parsing::Token::deepClone((Token *)in_stack_000000e0,in_stack_000000d8);
  deepClone<slang::syntax::NameSyntax>(in_stack_000000e0,in_stack_000000d8);
  parsing::Token::deepClone((Token *)in_stack_000000e0,in_stack_000000d8);
  parsing::Token::deepClone((Token *)in_stack_000000e0,in_stack_000000d8);
  pFVar1 = BumpAllocator::
           emplace<slang::syntax::ForeachLoopListSyntax,slang::parsing::Token,slang::syntax::NameSyntax&,slang::parsing::Token,slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>&,slang::parsing::Token,slang::parsing::Token>
                     (in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008,
                      unaff_retaddr,(Token *)__fn,in_stack_00000030);
  return (int)pFVar1;
}

Assistant:

static SyntaxNode* clone(const ForeachLoopListSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ForeachLoopListSyntax>(
        node.openParen.deepClone(alloc),
        *deepClone<NameSyntax>(*node.arrayName, alloc),
        node.openBracket.deepClone(alloc),
        *deepClone(node.loopVariables, alloc),
        node.closeBracket.deepClone(alloc),
        node.closeParen.deepClone(alloc)
    );
}